

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_slider(nk_command_buffer *out,nk_flags state,nk_style_slider *style,nk_rect *bounds,
                   nk_rect *visual_cursor,float min,float value,float max)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  nk_rect rect;
  nk_rect rect_00;
  float fVar5;
  float fVar6;
  nk_style_item *local_78;
  nk_style_item *cursor;
  nk_style_slider *pnStack_68;
  nk_color bar_color;
  nk_style_item *background;
  nk_rect bar;
  nk_rect fill;
  float max_local;
  float value_local;
  float min_local;
  nk_rect *visual_cursor_local;
  nk_rect *bounds_local;
  nk_style_slider *style_local;
  nk_flags state_local;
  nk_command_buffer *out_local;
  
  if ((state & 0x20) == 0) {
    if ((state & 0x10) == 0) {
      cursor._4_4_ = style->bar_normal;
      local_78 = &style->cursor_normal;
      pnStack_68 = style;
    }
    else {
      pnStack_68 = (nk_style_slider *)&style->hover;
      cursor._4_4_ = style->bar_hover;
      local_78 = &style->cursor_hover;
    }
  }
  else {
    pnStack_68 = (nk_style_slider *)&style->active;
    cursor._4_4_ = style->bar_active;
    local_78 = &style->cursor_active;
  }
  fVar1 = bounds->x;
  fVar5 = (visual_cursor->y + visual_cursor->h / 2.0) - bounds->h / 12.0;
  fVar2 = bounds->w;
  fVar6 = bounds->h / 6.0;
  fVar3 = visual_cursor->x;
  fVar4 = visual_cursor->w;
  if ((pnStack_68->normal).type == NK_STYLE_ITEM_IMAGE) {
    nk_draw_image(out,*bounds,&(pnStack_68->normal).data.image,(nk_color)0xffffffff);
  }
  else {
    nk_fill_rect(out,*bounds,style->rounding,(pnStack_68->normal).data.color);
    nk_stroke_rect(out,*bounds,style->rounding,style->border,style->border_color);
  }
  rect.y = fVar5;
  rect.x = fVar1;
  rect.w = fVar2;
  rect.h = fVar6;
  nk_fill_rect(out,rect,style->rounding,cursor._4_4_);
  rect_00.y = fVar5;
  rect_00.x = fVar1;
  rect_00.w = (fVar3 + fVar4 / 2.0) - fVar1;
  rect_00.h = fVar6;
  nk_fill_rect(out,rect_00,style->rounding,style->bar_filled);
  if (local_78->type == NK_STYLE_ITEM_IMAGE) {
    nk_draw_image(out,*visual_cursor,&(local_78->data).image,(nk_color)0xffffffff);
  }
  else {
    nk_fill_circle(out,*visual_cursor,(local_78->data).color);
  }
  return;
}

Assistant:

NK_LIB void
nk_draw_slider(struct nk_command_buffer *out, nk_flags state,
    const struct nk_style_slider *style, const struct nk_rect *bounds,
    const struct nk_rect *visual_cursor, float min, float value, float max)
{
    struct nk_rect fill;
    struct nk_rect bar;
    const struct nk_style_item *background;

    /* select correct slider images/colors */
    struct nk_color bar_color;
    const struct nk_style_item *cursor;

    NK_UNUSED(min);
    NK_UNUSED(max);
    NK_UNUSED(value);

    if (state & NK_WIDGET_STATE_ACTIVED) {
        background = &style->active;
        bar_color = style->bar_active;
        cursor = &style->cursor_active;
    } else if (state & NK_WIDGET_STATE_HOVER) {
        background = &style->hover;
        bar_color = style->bar_hover;
        cursor = &style->cursor_hover;
    } else {
        background = &style->normal;
        bar_color = style->bar_normal;
        cursor = &style->cursor_normal;
    }
    /* calculate slider background bar */
    bar.x = bounds->x;
    bar.y = (visual_cursor->y + visual_cursor->h/2) - bounds->h/12;
    bar.w = bounds->w;
    bar.h = bounds->h/6;

    /* filled background bar style */
    fill.w = (visual_cursor->x + (visual_cursor->w/2.0f)) - bar.x;
    fill.x = bar.x;
    fill.y = bar.y;
    fill.h = bar.h;

    /* draw background */
    if (background->type == NK_STYLE_ITEM_IMAGE) {
        nk_draw_image(out, *bounds, &background->data.image, nk_white);
    } else {
        nk_fill_rect(out, *bounds, style->rounding, background->data.color);
        nk_stroke_rect(out, *bounds, style->rounding, style->border, style->border_color);
    }

    /* draw slider bar */
    nk_fill_rect(out, bar, style->rounding, bar_color);
    nk_fill_rect(out, fill, style->rounding, style->bar_filled);

    /* draw cursor */
    if (cursor->type == NK_STYLE_ITEM_IMAGE)
        nk_draw_image(out, *visual_cursor, &cursor->data.image, nk_white);
    else nk_fill_circle(out, *visual_cursor, cursor->data.color);
}